

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O1

void __thiscall TPZFMatrix<long>::TPZFMatrix(TPZFMatrix<long> *this,void **vtt,TPZFMatrix<long> *A)

{
  int64_t iVar1;
  int64_t iVar2;
  long *__dest;
  ulong uVar3;
  
  (this->super_TPZMatrix<long>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)vtt[3];
  (this->super_TPZMatrix<long>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)vtt[2];
  iVar1 = (A->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow;
  iVar2 = (A->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol;
  (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fDecomposed = '\0';
  (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fDefPositive = '\0';
  (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow = 0;
  (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol = 0;
  (this->super_TPZMatrix<long>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)vtt[1];
  (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow = iVar1;
  (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol = iVar2;
  (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fDecomposed = '\0';
  (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fDefPositive = '\0';
  (this->super_TPZMatrix<long>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)*vtt;
  this->fElem = (long *)0x0;
  this->fGiven = (long *)0x0;
  this->fSize = 0;
  TPZVec<int>::TPZVec(&(this->fPivot).super_TPZVec<int>,0);
  (this->fPivot).super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  (this->fPivot).super_TPZVec<int>.fStore = (this->fPivot).fExtAlloc;
  (this->fPivot).super_TPZVec<int>.fNElements = 0;
  (this->fPivot).super_TPZVec<int>.fNAlloc = 0;
  (this->fWork)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5f0;
  (this->fWork).fStore = (long *)0x0;
  (this->fWork).fNElements = 0;
  (this->fWork).fNAlloc = 0;
  uVar3 = (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol *
          (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow;
  if (uVar3 != 0) {
    __dest = (long *)operator_new__(-(ulong)(uVar3 >> 0x3d != 0) | uVar3 * 8);
    this->fElem = __dest;
    memcpy(__dest,A->fElem,uVar3 * 8);
    return;
  }
  return;
}

Assistant:

TPZFMatrix<TVar>::TPZFMatrix(const TPZFMatrix<TVar> &A)
: TPZRegisterClassId(&TPZFMatrix::ClassId),
TPZMatrix<TVar>( A.fRow, A.fCol ), fElem(0), fGiven(0), fSize(0) {
    int64_t size = this->fRow * this->fCol;
    if(!size) return;
    fElem = new TVar[ size ] ;
#ifdef PZDEBUG2
    if ( size && fElem == NULL ) Error( "Constructor <memory allocation error>." );
#endif
    // Copia a matriz
    TVar * src = A.fElem;
    TVar * p = fElem;
    memcpy((void *)(p),(void *)(src),(size_t)size*sizeof(TVar));
}